

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O2

void __thiscall gui::ChatBox::updateScroll(ChatBox *this,int delta)

{
  int iVar1;
  size_type sVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = delta + (int)this->verticalScroll_;
  sVar2 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size(&this->lines_);
  iVar1 = 0;
  if (sVar2 != 0) {
    sVar2 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size(&this->lines_);
    iVar1 = (int)sVar2 + -1;
  }
  iVar4 = 0;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  if (iVar1 < iVar4) {
    iVar4 = iVar1;
  }
  if (this->verticalScroll_ == (long)iVar4) {
    return;
  }
  this->verticalScroll_ = (long)iVar4;
  updateVisibleLines(this,false);
  return;
}

Assistant:

void ChatBox::updateScroll(int delta) {
    size_t newScroll = std::min(std::max(static_cast<int>(verticalScroll_) + delta, 0), static_cast<int>(lines_.size() > 0 ? lines_.size() - 1 : 0));
    if (verticalScroll_ != newScroll) {
        verticalScroll_ = newScroll;
        updateVisibleLines();
    }
}